

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_token.cpp
# Opt level: O2

void __thiscall CNetTokenCache::Update(CNetTokenCache *this)

{
  CConnlessPacketInfo **ppCVar1;
  long lVar2;
  CConnlessPacketInfo *pCVar3;
  int64 iVar4;
  void *pvVar5;
  int64 iVar6;
  CConnlessPacketInfo *pCVar7;
  NETADDR *pNVar8;
  
  iVar4 = time_get();
  while( true ) {
    pvVar5 = CRingBufferBase::First((CRingBufferBase *)this);
    if ((pvVar5 == (void *)0x0) || (iVar4 < *(long *)((long)pvVar5 + 0x20))) break;
    CRingBufferBase::PopFirst((CRingBufferBase *)this);
  }
  ppCVar1 = &this->m_pConnlessPacketList;
  for (pNVar8 = (NETADDR *)ppCVar1; pNVar8 = *(NETADDR **)pNVar8, pNVar8 != (NETADDR *)0x0;
      pNVar8 = pNVar8 + 0x3d) {
    lVar2 = *(long *)(pNVar8[0x3b].ip + 0xc);
    iVar6 = time_freq();
    if (iVar6 * 2 + lVar2 <= iVar4) {
      FetchToken(this,pNVar8);
      *(int64 *)(pNVar8[0x3b].ip + 0xc) = iVar4;
    }
  }
  pCVar7 = *ppCVar1;
  while ((pCVar7 != (CConnlessPacketInfo *)0x0 && (pCVar7->m_Expiry <= iVar4))) {
    pCVar3 = pCVar7->m_pNext;
    operator_delete(pCVar7,0x5c0);
    *ppCVar1 = pCVar3;
    pCVar7 = pCVar3;
  }
  return;
}

Assistant:

void CNetTokenCache::Update()
{
	int64 Now = time_get();

	// drop expired address info
	CAddressInfo *pAddrInfo;
	while((pAddrInfo = m_TokenCache.First()) && (pAddrInfo->m_Expiry <= Now))
		m_TokenCache.PopFirst();

	// try to fetch the token again for stored packets
	CConnlessPacketInfo * pEntry = m_pConnlessPacketList;
	while(pEntry)
	{
		if(pEntry->m_LastTokenRequest + 2*time_freq() <= Now)
		{
			FetchToken(&pEntry->m_Addr);
			pEntry->m_LastTokenRequest = Now;
		}
		pEntry = pEntry->m_pNext;
	}

	// drop expired packets
	while(m_pConnlessPacketList && m_pConnlessPacketList->m_Expiry <= Now)
	{
		CConnlessPacketInfo *pNewList = m_pConnlessPacketList->m_pNext;
		delete m_pConnlessPacketList;
		m_pConnlessPacketList = pNewList;
	}
}